

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.c
# Opt level: O3

int utf8_check_string(char *string,size_t length)

{
  byte bVar1;
  uchar u;
  size_t sVar2;
  ulong size;
  ulong uVar3;
  
  if (length != 0) {
    uVar3 = 0;
    do {
      bVar1 = string[uVar3];
      if ((char)bVar1 < '\0') {
        if (bVar1 < 0xc0) {
          return 0;
        }
        if ((bVar1 & 0xfe) == 0xc0) {
          return 0;
        }
        size = 2;
        if (((0xdf < bVar1) && (size = 3, 0xef < bVar1)) && (size = 4, 0xf4 < bVar1)) {
          return 0;
        }
        if (length - uVar3 < size) {
          return 0;
        }
        sVar2 = utf8_check_full(string + uVar3,size,(int32_t *)0x0);
        if (sVar2 == 0) {
          return 0;
        }
        uVar3 = (uVar3 + size) - 1;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < length);
  }
  return 1;
}

Assistant:

int utf8_check_string(const char *string, size_t length)
{
    size_t i;

    for(i = 0; i < length; i++)
    {
        size_t count = utf8_check_first(string[i]);
        if(count == 0)
            return 0;
        else if(count > 1)
        {
            if(count > length - i)
                return 0;

            if(!utf8_check_full(&string[i], count, NULL))
                return 0;

            i += count - 1;
        }
    }

    return 1;
}